

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManTransferTiming(Gia_Man_t *p,Gia_Man_t *pGia)

{
  Gia_Man_t *pGia_local;
  Gia_Man_t *p_local;
  
  if ((pGia->vInArrs != (Vec_Flt_t *)0x0) || (pGia->vOutReqs != (Vec_Flt_t *)0x0)) {
    p->vInArrs = pGia->vInArrs;
    pGia->vInArrs = (Vec_Flt_t *)0x0;
    p->vOutReqs = pGia->vOutReqs;
    pGia->vOutReqs = (Vec_Flt_t *)0x0;
    p->DefInArrs = pGia->DefInArrs;
    p->DefOutReqs = pGia->DefOutReqs;
  }
  if ((pGia->vNamesIn != (Vec_Ptr_t *)0x0) || (pGia->vNamesOut != (Vec_Ptr_t *)0x0)) {
    p->vNamesIn = pGia->vNamesIn;
    pGia->vNamesIn = (Vec_Ptr_t *)0x0;
    p->vNamesOut = pGia->vNamesOut;
    pGia->vNamesOut = (Vec_Ptr_t *)0x0;
  }
  if ((pGia->vConfigs != (Vec_Int_t *)0x0) || (pGia->pCellStr != (char *)0x0)) {
    p->vConfigs = pGia->vConfigs;
    pGia->vConfigs = (Vec_Int_t *)0x0;
    p->pCellStr = pGia->pCellStr;
    pGia->pCellStr = (char *)0x0;
  }
  if ((pGia->pManTime != (void *)0x0) && (p != pGia)) {
    p->pManTime = pGia->pManTime;
    pGia->pManTime = (void *)0x0;
    p->pAigExtra = pGia->pAigExtra;
    pGia->pAigExtra = (Gia_Man_t *)0x0;
    p->vRegClasses = pGia->vRegClasses;
    pGia->vRegClasses = (Vec_Int_t *)0x0;
    p->vRegInits = pGia->vRegInits;
    pGia->vRegInits = (Vec_Int_t *)0x0;
    p->nAnd2Delay = pGia->nAnd2Delay;
    pGia->nAnd2Delay = 0;
  }
  return;
}

Assistant:

void Gia_ManTransferTiming( Gia_Man_t * p, Gia_Man_t * pGia )
{
    if ( pGia->vInArrs || pGia->vOutReqs )
    {
        p->vInArrs     = pGia->vInArrs;     pGia->vInArrs     = NULL;
        p->vOutReqs    = pGia->vOutReqs;    pGia->vOutReqs    = NULL;
        p->DefInArrs   = pGia->DefInArrs;
        p->DefOutReqs  = pGia->DefOutReqs;
    }
    if ( pGia->vNamesIn || pGia->vNamesOut )
    {
        p->vNamesIn     = pGia->vNamesIn;     pGia->vNamesIn     = NULL;
        p->vNamesOut    = pGia->vNamesOut;    pGia->vNamesOut    = NULL;
    }
    if ( pGia->vConfigs || pGia->pCellStr )
    {
        p->vConfigs     = pGia->vConfigs;     pGia->vConfigs     = NULL;
        p->pCellStr     = pGia->pCellStr;     pGia->pCellStr     = NULL;
    }
    if ( pGia->pManTime == NULL || p == pGia )
        return;
    p->pManTime    = pGia->pManTime;    pGia->pManTime    = NULL;
    p->pAigExtra   = pGia->pAigExtra;   pGia->pAigExtra   = NULL;
    p->vRegClasses = pGia->vRegClasses; pGia->vRegClasses = NULL;
    p->vRegInits   = pGia->vRegInits;   pGia->vRegInits = NULL;
    p->nAnd2Delay  = pGia->nAnd2Delay;  pGia->nAnd2Delay  = 0;
}